

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O1

void __thiscall MedianFilterCV_8U::filter(MedianFilterCV_8U *this)

{
  byte bVar1;
  pair<unsigned_char,_unsigned_char> pVar2;
  Mat *pMVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int y;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  pMVar3 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(pMVar3,*(int *)(this->sourceImage + 8),*(int *)(this->sourceImage + 0xc),0);
  this->resultImage = pMVar3;
  pMVar3 = this->sourceImage;
  if (2 < *(int *)(pMVar3 + 8)) {
    lVar8 = 1;
    do {
      pMVar3 = this->sourceImage;
      if (3 < *(int *)(pMVar3 + 0xc)) {
        lVar9 = 1;
        do {
          pVar2 = getPairMedian(this,pMVar3,(int)lVar8,(int)lVar9,false);
          bVar4 = *(byte *)(lVar9 + **(long **)(this->sourceImage + 0x48) * lVar8 +
                                    *(long *)(this->sourceImage + 0x10));
          uVar6 = (uint)bVar4 - ((ushort)pVar2 & 0xff);
          uVar5 = -uVar6;
          if (0 < (int)uVar6) {
            uVar5 = uVar6;
          }
          if ((uint)this->threshold < (uVar5 & 0xffff)) {
            bVar4 = pVar2.first;
          }
          *(byte *)(lVar9 + **(long **)(this->resultImage + 0x48) * lVar8 +
                            *(long *)(this->resultImage + 0x10)) = bVar4;
          bVar4 = *(byte *)(lVar9 + 1 +
                           **(long **)(this->sourceImage + 0x48) * lVar8 +
                           *(long *)(this->sourceImage + 0x10));
          uVar6 = (uint)bVar4 - (uint)((ushort)pVar2 >> 8);
          uVar5 = -uVar6;
          if (0 < (int)uVar6) {
            uVar5 = uVar6;
          }
          if ((uint)this->threshold < (uVar5 & 0xffff)) {
            bVar4 = pVar2.second;
          }
          *(byte *)(lVar9 + 1 +
                   **(long **)(this->resultImage + 0x48) * lVar8 +
                   *(long *)(this->resultImage + 0x10)) = bVar4;
          lVar9 = lVar9 + 2;
          pMVar3 = this->sourceImage;
        } while (lVar9 < (long)*(int *)(pMVar3 + 0xc) + -2);
      }
      lVar8 = lVar8 + 1;
      pMVar3 = this->sourceImage;
    } while (lVar8 < (long)*(int *)(pMVar3 + 8) + -1);
  }
  if ((*(uint *)(pMVar3 + 0xc) & 0x80000001) == 1) {
    lVar8 = (long)(int)*(uint *)(pMVar3 + 0xc) + -2;
    pMVar3 = this->sourceImage;
    uVar5 = *(uint *)(pMVar3 + 8);
    if ((int)uVar5 < 4) {
      uVar7 = (ulong)(uVar5 - 2);
    }
    else {
      lVar9 = 1;
      do {
        pVar2 = getPairMedian(this,pMVar3,(int)lVar9,(int)lVar8,true);
        bVar4 = *(byte *)(lVar8 + **(long **)(this->sourceImage + 0x48) * lVar9 +
                                  *(long *)(this->sourceImage + 0x10));
        uVar6 = (uint)bVar4 - ((ushort)pVar2 & 0xff);
        uVar5 = -uVar6;
        if (0 < (int)uVar6) {
          uVar5 = uVar6;
        }
        if ((uint)this->threshold < (uVar5 & 0xffff)) {
          bVar4 = pVar2.first;
        }
        *(byte *)(lVar8 + **(long **)(this->resultImage + 0x48) * lVar9 +
                          *(long *)(this->resultImage + 0x10)) = bVar4;
        bVar4 = *(byte *)(lVar8 + **(long **)(this->sourceImage + 0x48) * (lVar9 + 1) +
                                  *(long *)(this->sourceImage + 0x10));
        uVar6 = (uint)bVar4 - (uint)((ushort)pVar2 >> 8);
        uVar5 = -uVar6;
        if (0 < (int)uVar6) {
          uVar5 = uVar6;
        }
        if ((uint)this->threshold < (uVar5 & 0xffff)) {
          bVar4 = pVar2.second;
        }
        *(byte *)(lVar8 + (lVar9 + 1) * **(long **)(this->resultImage + 0x48) +
                          *(long *)(this->resultImage + 0x10)) = bVar4;
        lVar9 = lVar9 + 2;
        pMVar3 = this->sourceImage;
        uVar5 = *(uint *)(pMVar3 + 8);
        uVar7 = (long)(int)uVar5 - 2;
      } while (lVar9 < (long)uVar7);
    }
    if ((uVar5 & 0x80000001) == 1) {
      bVar1 = getMedian(this,pMVar3,(int)uVar7,(int)lVar8);
      pMVar3 = this->sourceImage;
      bVar4 = *(byte *)(lVar8 + (long)(int)uVar7 * **(long **)(pMVar3 + 0x48) +
                                *(long *)(pMVar3 + 0x10));
      uVar6 = (uint)bVar4 - (uint)bVar1;
      uVar5 = -uVar6;
      if (0 < (int)uVar6) {
        uVar5 = uVar6;
      }
      if ((uint)this->threshold < (uVar5 & 0xff)) {
        bVar4 = bVar1;
      }
      *(byte *)((long)*(int *)(pMVar3 + 0xc) + -2 +
               ((long)*(int *)(pMVar3 + 8) + -2) * **(long **)(this->resultImage + 0x48) +
               *(long *)(this->resultImage + 0x10)) = bVar4;
    }
  }
  filterImageEdges(this,this->sourceImage);
  return;
}

Assistant:

void MedianFilterCV_8U::filter() {
    resultImage = new cv::Mat(sourceImage->rows, sourceImage->cols, CV_8U);

    std::pair<uchar, uchar> pairOfMedians;                                // 1 operation
    for (int y = 1; y < sourceImage->rows - 1; ++y) {                     // 1 + 5 operations at every step (539 steps if rows=1080)
        for (int x = 1; x < sourceImage->cols - 2; x += 2) {              // 1 + 5 operations at every step (959 steps if cols=1920)
            pairOfMedians = getPairMedian(*sourceImage, y, x, false);     // 1 operation + operations of getPairMedian(420/567)

            resultImage->at<uchar>(y, x) = getActualPixel(pairOfMedians.first, y, x);          // 2 operations + operations of getActual(9)
            resultImage->at<uchar>(y, x + 1) = getActualPixel(pairOfMedians.second, y, x + 1); // 4 operations + operations of getActual(9)
        }
    }

    // if the last two columns are not processed
    if (sourceImage->cols % 2 == 1) {                                     // 3 operations
        int x = sourceImage->cols - 2;                                    // 3 operations

        for (int y = 1; y < sourceImage->rows - 2; y += 2) {              // 1 + 5 operations at every step
            pairOfMedians = getPairMedian(*sourceImage, y, x, true);      // 2 operations + operations of getPairMedian (420/567)
            resultImage->at<uchar>(y, x) = getActualPixel(pairOfMedians.first, y, x);          // 3 operations + operations of getActual(9)
            resultImage->at<uchar>(y + 1, x) = getActualPixel(pairOfMedians.second, y + 1, x); // 5 operations + operations of getActual(9)
        }

        if (sourceImage->rows % 2 == 1) {
            int y = sourceImage->rows - 2;                                // 3 operations
            resultImage->at<uchar>(sourceImage->rows - 2, sourceImage->cols - 2) =
                    getActualPixel(getMedian(*sourceImage, y, x), y, x);  // 6 operations + operations of getActaulPixel
                                                                          // and getMedian
        }
    }

    filterImageEdges(*sourceImage);                                       // 1 operations + operations of filterImageEdges
}